

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::SDLGraphicsSystemTests::expectCreateWindow(SDLGraphicsSystemTests *this)

{
  WrapperMock *this_00;
  MockSpec<int_(unsigned_int)> *this_01;
  TypedExpectation<int_(unsigned_int)> *this_02;
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  *this_03;
  TypedExpectation<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
  *this_04;
  unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *x;
  unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_> *x_00;
  unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_> local_188;
  ByMoveWrapper<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_> local_160;
  ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_>_>
  local_138;
  Action<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
  local_128;
  unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> local_108;
  ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> local_e0;
  ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>_>
  local_b8;
  Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  local_a8;
  ReturnAction<int> local_88;
  Action<int_(unsigned_int)> local_78;
  WithoutMatchers local_55 [13];
  Matcher<unsigned_int> local_48;
  MockSpec<int_(unsigned_int)> local_30;
  SDLGraphicsSystemTests *local_10;
  SDLGraphicsSystemTests *this_local;
  
  local_10 = this;
  this_00 = &mock_ptr<testing::StrictMock<solitaire::SDL::WrapperMock>_>::operator*(&this->sdlMock)
             ->super_WrapperMock;
  testing::Matcher<unsigned_int>::Matcher(&local_48,0x20);
  SDL::WrapperMock::gmock_init(&local_30,this_00,&local_48);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<int_(unsigned_int)>::operator()
                      (&local_30,local_55,(void *)0x0);
  this_02 = testing::internal::MockSpec<int_(unsigned_int)>::InternalExpectedAt
                      (this_01,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x68,"*sdlMock","init(0x00000020u)");
  testing::Return<int>((testing *)&local_88,0);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_78,(ReturnAction *)&local_88);
  testing::internal::TypedExpectation<int_(unsigned_int)>::WillOnce(this_02,&local_78);
  testing::Action<int_(unsigned_int)>::~Action(&local_78);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_88);
  testing::internal::MockSpec<int_(unsigned_int)>::~MockSpec(&local_30);
  testing::Matcher<unsigned_int>::~Matcher(&local_48);
  this_03 = expectSDLCreateWindow
                      (this,(string *)(anonymous_namespace)::title_abi_cxx11_,0x280,0x348);
  makeSDLWindow((UniquePtr<SDL_Window> *)&local_108,this,(SDL_Window_conflict *)0x1);
  testing::ByMove<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>
            (&local_e0,(testing *)&local_108,x);
  testing::
  Return<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>>
            ((testing *)&local_b8,&local_e0);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_a8,(ReturnAction *)&local_b8);
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  ::WillOnce(this_03,&local_a8);
  testing::
  Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  ::~Action(&local_a8);
  testing::internal::
  ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>_>
  ::~ReturnAction(&local_b8);
  testing::internal::
  ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>::~ByMoveWrapper
            (&local_e0);
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr(&local_108);
  this_04 = expectSDLCreateRenderer(this,(SDL_Window_conflict *)0x1);
  makeSDLRenderer((UniquePtr<SDL_Renderer> *)&local_188,this,(SDL_Renderer_conflict *)0x2);
  testing::ByMove<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>>
            (&local_160,(testing *)&local_188,x_00);
  testing::
  Return<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>>>
            ((testing *)&local_138,&local_160);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_128,(ReturnAction *)&local_138);
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
  ::WillOnce(this_04,&local_128);
  testing::
  Action<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
  ::~Action(&local_128);
  testing::internal::
  ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_>_>
  ::~ReturnAction(&local_138);
  testing::internal::
  ByMoveWrapper<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_>::
  ~ByMoveWrapper(&local_160);
  std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>::~unique_ptr(&local_188);
  SDLGraphicsSystem::createWindow
            (&this->system,(string *)(anonymous_namespace)::title_abi_cxx11_,0x280,0x348);
  return;
}

Assistant:

void expectCreateWindow() {
        EXPECT_CALL(*sdlMock, init(SDL_INIT_VIDEO)).WillOnce(Return(success));
        expectSDLCreateWindow(title, windowWidth, windowHeight)
            .WillOnce(Return(ByMove(makeSDLWindow(windowPtr))));
        expectSDLCreateRenderer(windowPtr)
            .WillOnce(Return(ByMove(makeSDLRenderer(rendererPtr))));
        system.createWindow(title, windowWidth, windowHeight);
    }